

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall METADemuxer::METADemuxer(METADemuxer *this,BufferedReaderManager *readManager)

{
  BufferedReaderManager *readManager_local;
  METADemuxer *this_local;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer = (_func_int **)&PTR__METADemuxer_004415b0;
  std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::vector(&this->m_iterators);
  ContainerToReaderWrapper::ContainerToReaderWrapper(&this->m_containerReader,this,readManager);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_lastReportTime);
  this->m_readManager = readManager;
  std::__cxx11::string::string((string *)&this->m_streamName);
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::vector(&this->m_codecInfo);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
  ::map(&this->m_mplsStreamMap);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_processedTracks);
  this->m_flushDataMode = false;
  this->m_HevcFound = false;
  this->m_totalSize = 0;
  this->m_lastProgressY = 0;
  this->m_lastReadRez = 0;
  return;
}

Assistant:

METADemuxer::METADemuxer(const BufferedReaderManager& readManager)
    : m_containerReader(*this, readManager), m_readManager(readManager)
{
    m_flushDataMode = false;
    m_HevcFound = false;
    m_totalSize = 0;
    m_lastProgressY = 0;
    m_lastReadRez = 0;
}